

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdInitializeConfidentialTx(void *handle,uint32_t version,uint32_t locktime,char **tx_string)

{
  char *pcVar1;
  CfdException *this;
  string sStack_98;
  ConfidentialTransactionController ctxc;
  
  cfd::Initialize();
  if (tx_string != (char **)0x0) {
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              (&ctxc,version,locktime);
    cfd::AbstractTransactionController::GetHex_abi_cxx11_
              (&sStack_98,&ctxc.super_AbstractTransactionController);
    pcVar1 = cfd::capi::CreateString(&sStack_98);
    *tx_string = pcVar1;
    std::__cxx11::string::~string((string *)&sStack_98);
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctxc);
    return 0;
  }
  ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)0x4fbb12;
  ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0xb1;
  ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)anon_var_dwarf_76e153;
  cfd::core::logger::warn<>((CfdSourceLocation *)&ctxc,"tx output is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ctxc,"Failed to parameter. tx output is null.",(allocator *)&sStack_98);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&ctxc);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeConfidentialTx(
    void* handle, uint32_t version, uint32_t locktime, char** tx_string) {
  try {
    cfd::Initialize();
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    ConfidentialTransactionController ctxc(version, locktime);
    *tx_string = CreateString(ctxc.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}